

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O2

vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> * __thiscall
happly::PLYData::getVertexPositions
          (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
           *__return_storage_ptr__,PLYData *this,string *vertexElementName)

{
  pointer paVar1;
  pointer paVar2;
  Element *pEVar3;
  double *pdVar4;
  ulong uVar5;
  allocator local_89;
  string local_88;
  vector<double,_std::allocator<double>_> xPos;
  vector<double,_std::allocator<double>_> zPos;
  vector<double,_std::allocator<double>_> yPos;
  
  pEVar3 = getElement(this,vertexElementName);
  std::__cxx11::string::string((string *)&local_88,"x",(allocator *)&yPos);
  Element::getProperty<double>(&xPos,pEVar3,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  pEVar3 = getElement(this,vertexElementName);
  std::__cxx11::string::string((string *)&local_88,"y",(allocator *)&zPos);
  Element::getProperty<double>(&yPos,pEVar3,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  pEVar3 = getElement(this,vertexElementName);
  std::__cxx11::string::string((string *)&local_88,"z",&local_89);
  Element::getProperty<double>(&zPos,pEVar3,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  geometrycentral::surface::std::
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
            (__return_storage_ptr__,
             (long)xPos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)xPos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_88);
  paVar1 = (__return_storage_ptr__->
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  paVar2 = (__return_storage_ptr__->
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pdVar4 = paVar1->_M_elems + 2;
  for (uVar5 = 0; uVar5 < (ulong)(((long)paVar2 - (long)paVar1) / 0x18); uVar5 = uVar5 + 1) {
    ((array<double,_3UL> *)(pdVar4 + -2))->_M_elems[0] =
         xPos.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar5];
    pdVar4[-1] = yPos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5];
    *pdVar4 = zPos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
    pdVar4 = pdVar4 + 3;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&zPos);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&yPos);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&xPos);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::array<double, 3>> getVertexPositions(const std::string& vertexElementName = "vertex") {

    std::vector<double> xPos = getElement(vertexElementName).getProperty<double>("x");
    std::vector<double> yPos = getElement(vertexElementName).getProperty<double>("y");
    std::vector<double> zPos = getElement(vertexElementName).getProperty<double>("z");

    std::vector<std::array<double, 3>> result(xPos.size());
    for (size_t i = 0; i < result.size(); i++) {
      result[i][0] = xPos[i];
      result[i][1] = yPos[i];
      result[i][2] = zPos[i];
    }

    return result;
  }